

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IdWithExprCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdWithExprCoverageBinInitializerSyntax,slang::parsing::Token&,slang::syntax::WithClauseSyntax&>
          (BumpAllocator *this,Token *args,WithClauseSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  IdWithExprCoverageBinInitializerSyntax *pIVar6;
  
  pIVar6 = (IdWithExprCoverageBinInitializerSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IdWithExprCoverageBinInitializerSyntax *)this->endPtr < pIVar6 + 1) {
    pIVar6 = (IdWithExprCoverageBinInitializerSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pIVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pIVar6->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind =
       IdWithExprCoverageBinInitializer;
  (pIVar6->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar6->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pIVar6->id).kind = TVar2;
  (pIVar6->id).field_0x2 = uVar3;
  (pIVar6->id).numFlags = (NumericTokenFlags)NVar4.raw;
  (pIVar6->id).rawLen = uVar5;
  (pIVar6->id).info = pIVar1;
  (pIVar6->withClause).ptr = args_1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pIVar6;
  return pIVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }